

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_int(void *reference,size_t bin_size,const_strarray *value,uint16_t fraction,
                 size_t int_size)

{
  uint64_t local_60;
  uint64_t scaling;
  uint64_t j;
  int64_t iStack_48;
  int result;
  int64_t i;
  size_t int_size_local;
  const_strarray *pcStack_30;
  uint16_t fraction_local;
  const_strarray *value_local;
  size_t bin_size_local;
  void *reference_local;
  const_strarray *local_10;
  
  if (bin_size == int_size) {
    local_60 = 1;
    for (scaling = 0; scaling < fraction; scaling = scaling + 1) {
      local_60 = local_60 * 10;
    }
    i = int_size;
    int_size_local._6_2_ = fraction;
    pcStack_30 = value;
    value_local = (const_strarray *)bin_size;
    bin_size_local = (size_t)reference;
    local_10 = value;
    reference_local._4_4_ = isonumber_to_s64(&stack0xffffffffffffffb8,value->value,local_60);
    if (reference_local._4_4_ == 0) {
      if (i == 4) {
        *(int *)bin_size_local = (int)iStack_48;
      }
      else if (i == 8) {
        *(int64_t *)bin_size_local = iStack_48;
      }
      else {
        reference_local._4_4_ = -1;
      }
    }
  }
  else {
    reference_local._4_4_ = -1;
  }
  return reference_local._4_4_;
}

Assistant:

int
cfg_tobin_int(void *reference, size_t bin_size, const struct const_strarray *value, uint16_t fraction, size_t int_size) {
  int64_t i;
  int result;
  uint64_t j, scaling;

  if (bin_size != int_size) {
    return -1;
  }

  for (j = 0, scaling = 1; j < fraction; j++, scaling*=10);

  result = isonumber_to_s64(&i, strarray_get_first_c(value), scaling);
  if (result == 0) {
    switch (int_size) {
      case 4:
        *((int32_t *)reference) = i;
        break;
      case 8:
        *((int64_t *)reference) = i;
        break;
      default:
        return -1;
    }
  }
  return result;
}